

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O0

void compare_enums(vector<t_enum_*,_std::allocator<t_enum_*>_> *newEnumList,
                  vector<t_enum_*,_std::allocator<t_enum_*>_> *oldEnumList)

{
  t_enum *ptVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  mapped_type *pptVar4;
  reference pptVar5;
  undefined4 extraout_var_00;
  undefined8 uVar6;
  pointer ppVar7;
  _Self local_a8;
  _Base_ptr local_a0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>
  local_98;
  iterator newEnumMapIt;
  __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_> local_80;
  const_iterator oldEnumIt;
  __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_> local_60;
  t_enum **local_58;
  __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_> local_50;
  const_iterator newEnumIt;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
  newEnumMap;
  vector<t_enum_*,_std::allocator<t_enum_*>_> *oldEnumList_local;
  vector<t_enum_*,_std::allocator<t_enum_*>_> *newEnumList_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
         *)&newEnumIt);
  __gnu_cxx::__normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
  __normal_iterator(&local_50);
  local_58 = (t_enum **)std::vector<t_enum_*,_std::allocator<t_enum_*>_>::begin(newEnumList);
  local_50._M_current = local_58;
  while( true ) {
    local_60._M_current =
         (t_enum **)std::vector<t_enum_*,_std::allocator<t_enum_*>_>::end(newEnumList);
    bVar2 = __gnu_cxx::operator!=(&local_50,&local_60);
    if (!bVar2) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
              ::operator*(&local_50);
    ptVar1 = *pptVar5;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
              ::operator*(&local_50);
    iVar3 = (*((*pptVar5)->super_t_type).super_t_doc._vptr_t_doc[3])();
    pptVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
                            *)&newEnumIt,(key_type *)CONCAT44(extraout_var,iVar3));
    *pptVar4 = ptVar1;
    oldEnumIt._M_current =
         (t_enum **)
         __gnu_cxx::
         __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
         operator++(&local_50,0);
  }
  __gnu_cxx::__normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>::
  __normal_iterator(&local_80);
  local_80._M_current =
       (t_enum **)std::vector<t_enum_*,_std::allocator<t_enum_*>_>::begin(oldEnumList);
  while( true ) {
    newEnumMapIt._M_node =
         (_Base_ptr)std::vector<t_enum_*,_std::allocator<t_enum_*>_>::end(oldEnumList);
    bVar2 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
                        *)&newEnumMapIt);
    if (!bVar2) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>
    ::_Rb_tree_iterator(&local_98);
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
              ::operator*(&local_80);
    iVar3 = (*((*pptVar5)->super_t_type).super_t_doc._vptr_t_doc[3])();
    local_a0 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
                       *)&newEnumIt,(key_type *)CONCAT44(extraout_var_00,iVar3));
    local_98._M_node = local_a0;
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
                *)&newEnumIt);
    bVar2 = std::operator==(&local_98,&local_a8);
    if (bVar2) {
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
                ::operator*(&local_80);
      (*((*pptVar5)->super_t_type).super_t_doc._vptr_t_doc[3])();
      uVar6 = std::__cxx11::string::c_str();
      thrift_audit_warning(1,"Enum %s not found in new thrift file\n",uVar6);
    }
    else {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>
               ::operator->(&local_98);
      ptVar1 = ppVar7->second;
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
                ::operator*(&local_80);
      compare_enum_values(ptVar1,*pptVar5);
    }
    __gnu_cxx::__normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
    ::operator++(&local_80,0);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
          *)&newEnumIt);
  return;
}

Assistant:

void compare_enums(const std::vector<t_enum*>& newEnumList, const std::vector<t_enum*>& oldEnumList)
{
   std::map<std::string,t_enum*> newEnumMap;
   std::vector<t_enum*>::const_iterator newEnumIt;
   for(newEnumIt = newEnumList.begin(); newEnumIt != newEnumList.end(); newEnumIt++)
   {
      newEnumMap[(*newEnumIt)->get_name()] = *newEnumIt;
   }
   std::vector<t_enum*>::const_iterator oldEnumIt;
   for(oldEnumIt = oldEnumList.begin(); oldEnumIt != oldEnumList.end(); oldEnumIt++)
   {
      std::map<std::string,t_enum*>::iterator newEnumMapIt;
      newEnumMapIt = newEnumMap.find((*oldEnumIt)->get_name());

      if(newEnumMapIt == newEnumMap.end())
      {
         thrift_audit_warning(1, "Enum %s not found in new thrift file\n",(*oldEnumIt)->get_name().c_str());
      }
      else
      {
         compare_enum_values(newEnumMapIt->second, *oldEnumIt);
      }
   }
}